

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::nasm::Section::
emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
          (Section *this,OpType *args,shared_ptr<mocker::nasm::Addr> *args_1,
          shared_ptr<mocker::nasm::Addr> *args_2)

{
  allocator<char> local_49;
  string local_48;
  shared_ptr<mocker::nasm::Addr> *local_28;
  shared_ptr<mocker::nasm::Addr> *args_local_2;
  shared_ptr<mocker::nasm::Addr> *args_local_1;
  OpType *args_local;
  Section *this_local;
  
  local_28 = args_2;
  args_local_2 = args_1;
  args_local_1 = (shared_ptr<mocker::nasm::Addr> *)args;
  args_local = (OpType *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  emplaceLine<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
            (this,&local_48,(OpType *)args_local_1,args_local_2,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    emplaceLine<Type>("", std::forward<Args>(args)...);
  }